

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChDirectSolverLS.cpp
# Opt level: O3

void __thiscall
chrono::ChDirectSolverLS::WriteVector
          (ChDirectSolverLS *this,string *filename,ChVectorDynamic<double> *v)

{
  ChStreamOutAscii *this_00;
  long lVar1;
  ChStreamOutAsciiFile file;
  ChStreamOutAsciiFile local_310;
  
  ChStreamOutAsciiFile::ChStreamOutAsciiFile(&local_310,(filename->_M_dataplus)._M_p,_S_trunc);
  builtin_strncpy(local_310.super_ChStreamOutAscii.number_format,"%.12g",6);
  if (0 < (v->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows) {
    lVar1 = 0;
    do {
      this_00 = ChStreamOutAscii::operator<<
                          (&local_310.super_ChStreamOutAscii,
                           (v->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                           m_storage.m_data[lVar1]);
      ChStreamOutAscii::operator<<(this_00,"\n");
      lVar1 = lVar1 + 1;
    } while (lVar1 < (v->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                     m_rows);
  }
  ChStreamOutAsciiFile::~ChStreamOutAsciiFile(&local_310);
  return;
}

Assistant:

void ChDirectSolverLS::WriteVector(const std::string& filename, const ChVectorDynamic<double>& v) {
    ChStreamOutAsciiFile file(filename.c_str());
    file.SetNumFormat("%.12g");
    for (int i = 0; i < v.size(); i++)
        file << v(i) << "\n";
}